

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.cxx
# Opt level: O0

uint32_t crc32_8_last8(void *data,size_t len,uint32_t prev_value)

{
  uint32_t uVar1;
  uint32_t in_EDX;
  ulong in_RSI;
  long in_RDI;
  void *src;
  size_t min;
  undefined8 local_30;
  
  local_30 = in_RSI;
  if (7 < in_RSI) {
    local_30 = 8;
  }
  uVar1 = crc32_8((void *)(in_RDI + (in_RSI - local_30)),local_30,in_EDX);
  return uVar1;
}

Assistant:

uint32_t crc32_8_last8(const void* data, size_t len, uint32_t prev_value) {
    size_t min = MIN(len, 8);
    void *src = (char*)data + (len-min);
#ifdef _ALIGN_MEM_ACCESS
    uint64_t temp; // aligned
    memcpy(&temp, src, min);
    src = &temp;
#endif
    return crc32_8(src, min, prev_value);
}